

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void check_input(uchar **from0,size_t n0)

{
  int iVar1;
  size_t sVar2;
  
  if (1 < n0) {
    sVar2 = 1;
    do {
      if (from0[sVar2 - 1] == (uchar *)0x0) goto LAB_00124ea6;
      if (from0[sVar2] == (uchar *)0x0) goto LAB_00124ec5;
      sVar2 = sVar2 + 1;
    } while (n0 != sVar2);
    if (1 < n0) {
      sVar2 = 1;
      do {
        if (from0[sVar2 - 1] == (uchar *)0x0) {
LAB_00124ea6:
          __assert_fail("a != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
        }
        if (from0[sVar2] == (uchar *)0x0) {
LAB_00124ec5:
          __assert_fail("b != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
        }
        iVar1 = strcmp((char *)from0[sVar2 - 1],(char *)from0[sVar2]);
        if (0 < iVar1) {
          __assert_fail("cmp(from0[i-1],from0[i])<=0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x6c,"void check_input(unsigned char **, size_t)");
        }
        sVar2 = sVar2 + 1;
      } while (n0 != sVar2);
    }
  }
  return;
}

Assistant:

static void
check_input(unsigned char** from0, size_t n0)
{
	(void) from0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
#endif
}